

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O3

int libssh2_publickey_remove_ex
              (LIBSSH2_PUBLICKEY *pkey,uchar *name,unsigned_long name_len,uchar *blob,
              unsigned_long blob_len)

{
  size_t sVar1;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SESSION *session;
  uchar *puVar2;
  int iVar3;
  int iVar4;
  uchar *puVar5;
  ssize_t sVar6;
  char *errmsg;
  
  if (pkey == (LIBSSH2_PUBLICKEY *)0x0) {
    return -0x27;
  }
  channel = pkey->channel;
  session = channel->session;
  if (pkey->remove_state == libssh2_NB_state_idle) {
    sVar1 = name_len + 0x16 + blob_len;
    pkey->remove_packet = (uchar *)0x0;
    puVar5 = (uchar *)(*session->alloc)(sVar1,&session->abstract);
    pkey->remove_packet = puVar5;
    if (puVar5 == (uchar *)0x0) {
      errmsg = "Unable to allocate memory for publickey \"remove\" packet";
      iVar4 = -6;
      goto LAB_001204d5;
    }
    pkey->remove_s = puVar5;
    _libssh2_htonu32(puVar5,(int)sVar1 - 4);
    puVar5 = pkey->remove_s;
    pkey->remove_s = puVar5 + 4;
    _libssh2_htonu32(puVar5 + 4,6);
    puVar5 = pkey->remove_s;
    pkey->remove_s = puVar5 + 4;
    builtin_memcpy(puVar5 + 4,"remove",6);
    puVar5 = pkey->remove_s;
    pkey->remove_s = puVar5 + 6;
    _libssh2_htonu32(puVar5 + 6,(uint32_t)name_len);
    puVar5 = pkey->remove_s;
    pkey->remove_s = puVar5 + 4;
    memcpy(puVar5 + 4,name,name_len);
    puVar5 = pkey->remove_s;
    pkey->remove_s = puVar5 + name_len;
    _libssh2_htonu32(puVar5 + name_len,(uint32_t)blob_len);
    puVar5 = pkey->remove_s;
    pkey->remove_s = puVar5 + 4;
    memcpy(puVar5 + 4,blob,blob_len);
    puVar5 = pkey->remove_s + blob_len;
    pkey->remove_s = puVar5;
    pkey->remove_state = libssh2_NB_state_created;
  }
  else {
    if (pkey->remove_state != libssh2_NB_state_created) goto LAB_00120480;
    puVar5 = pkey->remove_s;
  }
  sVar6 = _libssh2_channel_write
                    (channel,0,pkey->remove_packet,(long)puVar5 - (long)pkey->remove_packet);
  if (sVar6 == -0x25) {
    return -0x25;
  }
  puVar5 = pkey->remove_packet;
  puVar2 = pkey->remove_s;
  (*session->free)(puVar5,&session->abstract);
  pkey->remove_packet = (uchar *)0x0;
  if ((long)puVar2 - (long)puVar5 != sVar6) {
    pkey->remove_state = libssh2_NB_state_idle;
    errmsg = "Unable to send publickey remove packet";
    iVar4 = -7;
LAB_001204d5:
    iVar4 = _libssh2_error(session,iVar4,errmsg);
    return iVar4;
  }
  pkey->remove_state = libssh2_NB_state_sent;
LAB_00120480:
  iVar3 = publickey_response_success(pkey);
  iVar4 = -0x25;
  if (iVar3 != -0x25) {
    pkey->remove_state = libssh2_NB_state_idle;
    iVar4 = iVar3;
  }
  return iVar4;
}

Assistant:

LIBSSH2_API int
libssh2_publickey_remove_ex(LIBSSH2_PUBLICKEY * pkey,
                            const unsigned char *name, unsigned long name_len,
                            const unsigned char *blob, unsigned long blob_len)
{
    LIBSSH2_CHANNEL *channel;
    LIBSSH2_SESSION *session;
    /* 22 = packet_len(4) + remove_len(4) + "remove"(6) + name_len(4) + {name}
       + blob_len(4) + {blob} */
    unsigned long packet_len = 22 + name_len + blob_len;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    channel = pkey->channel;
    session = channel->session;

    if(pkey->remove_state == libssh2_NB_state_idle) {
        pkey->remove_packet = NULL;

        pkey->remove_packet = LIBSSH2_ALLOC(session, packet_len);
        if(!pkey->remove_packet) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory for "
                                  "publickey \"remove\" packet");
        }

        pkey->remove_s = pkey->remove_packet;
        _libssh2_htonu32(pkey->remove_s, (uint32_t)(packet_len - 4));
        pkey->remove_s += 4;
        _libssh2_htonu32(pkey->remove_s, sizeof("remove") - 1);
        pkey->remove_s += 4;
        memcpy(pkey->remove_s, "remove", sizeof("remove") - 1);
        pkey->remove_s += sizeof("remove") - 1;
        _libssh2_htonu32(pkey->remove_s, (uint32_t)name_len);
        pkey->remove_s += 4;
        memcpy(pkey->remove_s, name, name_len);
        pkey->remove_s += name_len;
        _libssh2_htonu32(pkey->remove_s, (uint32_t)blob_len);
        pkey->remove_s += 4;
        memcpy(pkey->remove_s, blob, blob_len);
        pkey->remove_s += blob_len;

        _libssh2_debug((session, LIBSSH2_TRACE_PUBLICKEY,
                       "Sending publickey \"remove\" packet: "
                       "type=%s blob_len=%ld",
                       name, blob_len));

        pkey->remove_state = libssh2_NB_state_created;
    }

    if(pkey->remove_state == libssh2_NB_state_created) {
        ssize_t nwritten;
        nwritten = _libssh2_channel_write(channel, 0, pkey->remove_packet,
                                       (pkey->remove_s - pkey->remove_packet));
        if(nwritten == LIBSSH2_ERROR_EAGAIN) {
            return (int)nwritten;
        }
        else if((pkey->remove_s - pkey->remove_packet) != nwritten) {
            LIBSSH2_FREE(session, pkey->remove_packet);
            pkey->remove_packet = NULL;
            pkey->remove_state = libssh2_NB_state_idle;
            return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                  "Unable to send publickey remove packet");
        }
        LIBSSH2_FREE(session, pkey->remove_packet);
        pkey->remove_packet = NULL;

        pkey->remove_state = libssh2_NB_state_sent;
    }

    rc = publickey_response_success(pkey);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    }

    pkey->remove_state = libssh2_NB_state_idle;

    return rc;
}